

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RangeSink::AddFileRange
          (RangeSink *this,char *analyzer,string_view name,uint64_t fileoff,uint64_t filesize)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  pointer ppVar4;
  string_view format;
  DualMap *a2;
  Arg local_100;
  string local_d0;
  string label;
  Arg local_90;
  Arg local_60;
  
  verbose = IsVerboseForFileRange(this,fileoff,filesize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddFileRange(%.*s, %lx, %lx)\n",pcVar3,analyzer,name._M_len,name._M_str,fileoff
           ,filesize);
  }
  ppVar1 = (this->outputs_).
           super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->outputs_).
                super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    NameMunger::Munge_abi_cxx11_(&label,ppVar4->second,name);
    a2 = ppVar4->first;
    if (this->translator_ == (DualMap *)0x0) {
      RangeMap::AddRange(&a2->file_map,fileoff,filesize,&label);
    }
    else {
      bVar2 = RangeMap::AddRangeWithTranslation
                        (&a2->file_map,fileoff,filesize,&label,&this->translator_->file_map,verbose,
                         &a2->vm_map);
      if (!bVar2 && 0 < verbose_level) {
        absl::substitute_internal::Arg::Arg(&local_90,fileoff);
        absl::substitute_internal::Arg::Arg(&local_60,filesize);
        format._M_str = (char *)&local_90;
        format._M_len = (size_t)"File range ($0, $1) for label $2 extends beyond base map";
        local_100.piece_._M_len = name._M_len;
        local_100.piece_._M_str = name._M_str;
        absl::Substitute_abi_cxx11_(&local_d0,(absl *)0x38,format,&local_60,&local_100,(Arg *)a2);
        printf("WARNING: %s\n",local_d0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
    std::__cxx11::string::~string((string *)&label);
  }
  return;
}

Assistant:

void RangeSink::AddFileRange(const char* analyzer, string_view name,
                             uint64_t fileoff, uint64_t filesize) {
  bool verbose = IsVerboseForFileRange(fileoff, filesize);
  if (verbose) {
    printf("[%s, %s] AddFileRange(%.*s, %" PRIx64 ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), fileoff, filesize);
  }
  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    if (translator_) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          fileoff, filesize, label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             fileoff, filesize, name);
      }
    } else {
      pair.first->file_map.AddRange(fileoff, filesize, label);
    }
  }
}